

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_3>
::doApply(IRet *__return_storage_ptr__,
         GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_3>
         *this,EvalContext *ctx,IArgs *iargs)

{
  bool *pbVar1;
  long lVar2;
  bool *local_68;
  bool *local_60;
  bool *local_58;
  Void *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  tcu::Vector<tcu::Interval,_3>::Vector(__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 0x48; lVar2 = lVar2 + 0x18) {
    local_68 = &iargs->a->m_data[0].m_hasNaN + lVar2;
    local_60 = &iargs->b->m_data[0].m_hasNaN + lVar2;
    local_58 = &iargs->c->m_data[0].m_hasNaN + lVar2;
    local_50 = iargs->d;
    (*(this->m_func->super_FuncBase)._vptr_FuncBase[8])(&local_48,this->m_func,ctx,&local_68);
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2) = local_38;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined4 *)pbVar1 = local_48;
    *(undefined4 *)(pbVar1 + 4) = uStack_44;
    *(undefined4 *)(pbVar1 + 8) = uStack_40;
    *(undefined4 *)(pbVar1 + 0xc) = uStack_3c;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply					(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet ret;

		for (int ndx = 0; ndx < Size; ++ndx)
		{
			ret[ndx] =
				m_func.apply(ctx, iargs.a[ndx], iargs.b[ndx], iargs.c[ndx], iargs.d[ndx]);
		}

		return ret;
	}